

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

string * testing::internal::StripTrailingSpaces(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  bool bVar2;
  pointer pcVar3;
  pointer pcVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (str->_M_dataplus)._M_p;
  pcVar4 = pcVar3 + str->_M_string_length;
  while (pcVar4 != pcVar3) {
    bVar2 = IsSpace(pcVar4[-1]);
    if (!bVar2) break;
    pcVar4 = (pointer)std::__cxx11::string::erase(str,pcVar4 + -1);
    pcVar3 = (str->_M_dataplus)._M_p;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline std::string StripTrailingSpaces(std::string str) {
  std::string::iterator it = str.end();
  while (it != str.begin() && IsSpace(*--it))
    it = str.erase(it);
  return str;
}